

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashSet.hpp
# Opt level: O0

Iterator __thiscall HashSet<String>::find(HashSet<String> *this,String *key)

{
  bool bVar1;
  usize uVar2;
  Item *local_30;
  Item *item;
  usize hashCode;
  String *key_local;
  HashSet<String> *this_local;
  
  if (this->data == (Item **)0x0) {
    this_local = (HashSet<String> *)(this->_end).item;
  }
  else {
    uVar2 = hash(key);
    for (local_30 = this->data[uVar2 % this->capacity]; local_30 != (Item *)0x0;
        local_30 = local_30->nextCell) {
      bVar1 = String::operator==(&local_30->key,key);
      if (bVar1) {
        Iterator::Iterator((Iterator *)&this_local,local_30);
        return (Iterator)(Item *)this_local;
      }
    }
    this_local = (HashSet<String> *)(this->_end).item;
  }
  return (Iterator)(Item *)this_local;
}

Assistant:

Iterator find(const T& key) const
  {
    if(!data) return _end;
    usize hashCode = hash(key);
    Item* item = data[hashCode % capacity];
    while(item)
    {
      if(item->key == key) return item;
      item = item->nextCell;
    }
    return _end;
  }